

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  Module nasmModule;
  Stats stats;
  Module irModule;
  ofstream dumpIR;
  undefined1 local_2d8 [24];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_2c0;
  Stats local_288;
  Module local_280;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  if (argc < 1) {
    bVar3 = false;
  }
  else {
    uVar4 = 0;
    bVar3 = false;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_230,argv[uVar4],(allocator<char> *)&local_280);
      iVar1 = std::__cxx11::string::compare((char *)local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._0_8_ != local_220) {
        operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity + 1);
      }
      if (iVar1 == 0) {
        bVar3 = true;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)argc != uVar4);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_230,argv[1],(allocator<char> *)local_2d8);
  runFrontend(&local_280,(string *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    local_288.module = &local_280;
    sVar2 = mocker::ir::Stats::countInsts<mocker::ir::Phi>(&local_288);
    if (sVar2 != 0) {
      __assert_fail("stats.countInsts<mocker::ir::Phi>() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/main.cpp"
                    ,0x41,"int main(int, char **)");
    }
    optimize(&local_280);
    if (2 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2d8,argv[2],(allocator<char> *)local_230);
      std::ofstream::ofstream(local_230,(string *)local_2d8,_S_out);
      mocker::ir::printModule(&local_280,(ostream *)local_230);
      local_230._0_8_ = _VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = _memcpy;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(local_138);
      if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
        operator_delete((void *)local_2d8._0_8_,
                        (ulong)((long)&((__shared_ptr<mocker::nasm::Directive,_(__gnu_cxx::_Lock_policy)2>
                                         *)local_2d8._16_8_)->_M_ptr + 1));
      }
    }
    codegen((Module *)local_2d8,&local_280);
    if (argc < 4) {
      mocker::nasm::printModule((Module *)local_2d8,(ostream *)&std::cout);
    }
    else {
      std::ofstream::ofstream(local_230,argv[3],_S_out);
      mocker::nasm::printModule((Module *)local_2d8,(ostream *)local_230);
      std::ofstream::close();
      local_230._0_8_ = _VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = _memcpy;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(local_138);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_2c0);
    std::
    vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
    ::~vector((vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
               *)local_2d8);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_280.funcs._M_h);
  std::__cxx11::_List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>::_M_clear
            ((_List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_> *)&local_280
            );
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  bool semanticOnly = false;
  for (int i = 0; i < argc; ++i) {
    if (std::string(argv[i]) == "--semantic")
      semanticOnly = true;
  }

  auto irModule = runFrontend(argv[1]);

  if (semanticOnly)
    return 0;

  mocker::ir::Stats stats(irModule);
  assert(stats.countInsts<mocker::ir::Phi>() == 0);

  optimize(irModule);

  if (argc >= 3) {
    std::string irPath = argv[2];
    std::ofstream dumpIR(irPath);
    mocker::ir::printModule(irModule, dumpIR);
  }

  auto nasmModule = codegen(irModule);
  if (argc >= 4) {
    std::ofstream fout(argv[3]);
    mocker::nasm::printModule(nasmModule, fout);
    fout.close();
  } else {
    mocker::nasm::printModule(nasmModule, std::cout);
  }

  return 0;
}